

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPool.cpp
# Opt level: O2

Ptr<CommandPool> __thiscall
myvk::CommandPool::Create(CommandPool *this,Ptr<Queue> *queue,VkCommandPoolCreateFlags flags)

{
  element_type *peVar1;
  PFN_vkCreateCommandPool p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<CommandPool> PVar6;
  shared_ptr<myvk::CommandPool> ret;
  _func_int **local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  VkCommandPoolCreateInfo local_38;
  
  std::make_shared<myvk::CommandPool>();
  std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 3),
             &queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>);
  p_Var2 = vkCreateCommandPool;
  local_38.pNext = (void *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38._4_4_ = 0;
  peVar1 = (queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.queueFamilyIndex =
       ((peVar1->m_unique_queue_ptr).
        super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_family_index;
  local_38.flags = flags;
  iVar4 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268),&local_38,
                    (VkAllocationCallbacks *)0x0,(VkCommandPool *)(local_48 + 5));
  _Var3._M_pi = _Stack_40._M_pi;
  if (VVar5 == VK_SUCCESS) {
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_48;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<CommandPool>)PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<CommandPool> CommandPool::Create(const Ptr<Queue> &queue, VkCommandPoolCreateFlags flags) {
	auto ret = std::make_shared<CommandPool>();
	ret->m_queue_ptr = queue;

	VkCommandPoolCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
	create_info.queueFamilyIndex = queue->GetFamilyIndex();
	create_info.flags = flags;
	if (vkCreateCommandPool(queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_command_pool) !=
	    VK_SUCCESS)
		return nullptr;
	return ret;
}